

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O1

void test_z2_standart_field_operators<Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>>
               (void)

{
  uint uVar1;
  bool bVar2;
  uint local_524;
  uint local_520 [2];
  uint *local_518;
  uint *local_510;
  undefined **local_508;
  ulong local_500;
  shared_count sStack_4f8;
  uint **local_4f0;
  undefined **local_4e8;
  undefined1 local_4e0;
  undefined8 *local_4d8;
  undefined ***local_4d0;
  undefined1 local_4c8 [8];
  undefined8 local_4c0;
  shared_count sStack_4b8;
  undefined **local_4b0;
  char *local_4a8;
  undefined8 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_520[0] = 1;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x89);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = local_520[0] - 2;
  if (local_520[0] < 2) {
    local_524 = local_520[0];
  }
  local_518 = &local_524;
  local_510 = local_520 + 1;
  local_520[1] = 1;
  local_4c8[0] = local_524 == 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_4d0 = (undefined ***)&local_518;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x8a);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  if (local_520[0] == 0xffffffff) {
    local_524 = 0xfffffffe;
  }
  else {
    local_524 = local_520[0] - 1;
    if (local_520[0] + 1 < 2) {
      local_524 = local_520[0] + 1;
    }
  }
  local_4d0 = (undefined ***)&local_518;
  local_520[1] = 0;
  local_4c8[0] = local_524 == 0;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x8a,1,2,2,"z21 + 3",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x8b);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = 1;
  local_520[1] = 1;
  local_4c8[0] = 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x8b,1,2,2,"z22 + 3",&local_4e8,"1",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x8c);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = local_520[0] - 2;
  if (local_520[0] < 2) {
    local_524 = local_520[0];
  }
  local_4c8[0] = local_524 == 1;
  local_520[1] = 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132aa0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x8c,1,2,2,"6 + z21",&local_4e8,"1",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x8d);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = 0;
  local_520[1] = 0;
  local_4c8[0] = 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132aa0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  local_518 = &local_524;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x8d,1,2,2,"6 + z22",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  if (local_520[0] == 0xffffffff) {
    local_520[0] = 0xfffffffe;
  }
  else {
    uVar1 = local_520[0] + 1;
    local_520[0] = local_520[0] - 1;
    if (uVar1 < 2) {
      local_520[0] = uVar1;
    }
  }
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x8f);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_4c8[0] = local_520[0] == 0;
  local_524 = 0;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  local_518 = local_520;
  local_510 = &local_524;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  uVar1 = local_520[0] - 2;
  if (local_520[0] < 2) {
    uVar1 = local_520[0];
  }
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520[0] = uVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x91);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4c8[0] = local_520[0] == 0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = 0;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = local_520;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = &local_524;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x91,1,2,2,"z21",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x94);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = local_520[0];
  local_4c8[0] = local_520[0] == 0;
  local_520[1] = 0;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x94,1,2,2,"z21 - z22",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x95);
  local_524 = local_520[0] - 1;
  if (local_520[0] == 0) {
    local_524 = 1;
  }
  local_4c8[0] = local_524 == 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_520[1] = 1;
  local_4e0 = 0;
  local_500 = local_500 & 0xffffffffffffff00;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x95,1,2,2,"z21 - 3",&local_4e8,"1",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x96);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = 1;
  local_520[1] = 1;
  local_4c8[0] = 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x96,1,2,2,"z22 - 3",&local_4e8,"1",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x97);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = (uint)(local_520[0] != 0) * 2 - local_520[0];
  local_4c8[0] = local_524 == 0;
  local_520[1] = 0;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132aa0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x97,1,2,2,"6 - z21",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x98);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = 0;
  local_520[1] = 0;
  local_4c8[0] = 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132aa0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x98,1,2,2,"6 - z22",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  bVar2 = local_520[0] == 0;
  local_520[0] = local_520[0] - 1;
  if (bVar2) {
    local_520[0] = 1;
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x9a);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4c8[0] = local_520[0] == 1;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = local_520;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = &local_524;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x9a,1,2,2,"z21",&local_4e8,"1",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x9c);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8[0] = local_520[0] == 1;
  local_498 = "";
  local_524 = 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = local_520;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = &local_524;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x9c,1,2,2,"z21",&local_4e8,"1",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x9f);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::_multiply
                        (local_520[0],0);
  local_4c8[0] = local_524 == 0;
  local_520[1] = 0;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0x9f,1,2,2,"z21 * z22",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0xa0);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::_multiply
                        (local_520[0],1);
  local_4c8[0] = local_524 == 1;
  local_520[1] = 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0xa0,1,2,2,"z21 * 3",&local_4e8,"1",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0xa1);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::_multiply(0,1);
  local_4c8[0] = local_524 == 0;
  local_520[1] = 0;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0xa1,1,2,2,"z22 * 3",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0xa2);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::_multiply
                        (local_520[0],0);
  local_4c8[0] = local_524 == 0;
  local_520[1] = 0;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132aa0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0xa2,1,2,2,"6 * z21",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0xa3);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::_multiply(0,0);
  local_4c8[0] = local_524 == 0;
  local_520[1] = 0;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = &local_524;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132aa0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = local_520 + 1;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0xa3,1,2,2,"6 * z22",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_520[0] = Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::_multiply
                           (local_520[0],1);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0xa5);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8[0] = local_520[0] == 1;
  local_498 = "";
  local_524 = 1;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = local_520;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = &local_524;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0xa5,1,2,2,"z21",&local_4e8,"1",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_520[0] = Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::_multiply
                           (local_520[0],0);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,0xa7);
  local_4a8 = (char *)((ulong)local_4a8 & 0xffffffffffffff00);
  local_4b0 = &PTR__lazy_ostream_00132ae0;
  local_4c8[0] = local_520[0] == 0;
  local_4a0 = &boost::unit_test::lazy_ostream::inst;
  local_498 = "";
  local_524 = 0;
  local_4c0 = 0;
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_518 = local_520;
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132b20;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_4d0 = (undefined ***)&local_518;
  local_510 = &local_524;
  local_500 = local_500 & 0xffffffffffffff00;
  local_508 = &PTR__lazy_ostream_00132aa0;
  sStack_4f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f0 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c8,&local_4b0,&local_490,0xa7,1,2,2,"z21",&local_4e8,"0",&local_508);
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0xaa);
  local_500 = 0;
  sStack_4f8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = (undefined **)0x1292d3;
  local_4a8 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132be0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_2f8 = "";
  local_4d0 = &local_4b0;
  local_508._0_1_ = local_520[0] == 0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4f8);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0xab);
  local_508._0_1_ = local_520[0] == 0;
  local_500 = 0;
  sStack_4f8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = (undefined **)0x1292de;
  local_4a8 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132be0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_328 = "";
  local_4d0 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion(&local_508,&local_4e8,&local_330,0xab,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4f8);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0xac);
  local_508._0_1_ = local_520[0] == 0;
  local_500 = 0;
  sStack_4f8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = (undefined **)0x1292e7;
  local_4a8 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132be0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_358 = "";
  local_4d0 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion(&local_508,&local_4e8,&local_360,0xac,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4f8);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0xad);
  local_508._0_1_ = 1;
  local_500 = 0;
  sStack_4f8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = (undefined **)0x1292f0;
  local_4a8 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132be0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_388 = "";
  local_4d0 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion(&local_508,&local_4e8,&local_390,0xad,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4f8);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0xae);
  local_508._0_1_ = 1;
  local_500 = 0;
  sStack_4f8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = (undefined **)0x1292f9;
  local_4a8 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132be0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3b8 = "";
  local_4d0 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion(&local_508,&local_4e8,&local_3c0,0xae,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4f8);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0xaf);
  local_508._0_1_ = local_520[0] != 1;
  local_500 = 0;
  sStack_4f8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = (undefined **)0x129302;
  local_4a8 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132be0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3e8 = "";
  local_4d0 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion(&local_508,&local_4e8,&local_3f0,0xaf,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4f8);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0xb0);
  local_508._0_1_ = local_520[0] != 1;
  local_500 = 0;
  sStack_4f8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = (undefined **)0x12930b;
  local_4a8 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132be0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_418 = "";
  local_4d0 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion(&local_508,&local_4e8,&local_420,0xb0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4f8);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0xb1);
  local_508._0_1_ = 1;
  local_500 = 0;
  sStack_4f8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = (undefined **)0x129314;
  local_4a8 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132be0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_448 = "";
  local_4d0 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion(&local_508,&local_4e8,&local_450,0xb1,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4f8);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0xb2);
  local_508 = (undefined **)CONCAT71(local_508._1_7_,1);
  local_500 = 0;
  sStack_4f8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = (undefined **)0x12931d;
  local_4a8 = "";
  local_4e0 = 0;
  local_4e8 = &PTR__lazy_ostream_00132be0;
  local_4d8 = &boost::unit_test::lazy_ostream::inst;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_478 = "";
  local_4d0 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion(&local_508,&local_4e8,&local_480,0xb2,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4f8);
  return;
}

Assistant:

void test_z2_standart_field_operators() {
  Z2 z21(7);
  Z2 z22(2);

  //+
  BOOST_CHECK_EQUAL(z21 + z22, 1);
  BOOST_CHECK_EQUAL(z21 + 3, 0);
  BOOST_CHECK_EQUAL(z22 + 3, 1);
  BOOST_CHECK_EQUAL(6 + z21, 1);
  BOOST_CHECK_EQUAL(6 + z22, 0);
  z21 += 3;
  BOOST_CHECK_EQUAL(z21, 0);
  z21 += z22;
  BOOST_CHECK_EQUAL(z21, 0);

  //-
  BOOST_CHECK_EQUAL(z21 - z22, 0);
  BOOST_CHECK_EQUAL(z21 - 3, 1);
  BOOST_CHECK_EQUAL(z22 - 3, 1);
  BOOST_CHECK_EQUAL(6 - z21, 0);
  BOOST_CHECK_EQUAL(6 - z22, 0);
  z21 -= 3;
  BOOST_CHECK_EQUAL(z21, 1);
  z21 -= z22;
  BOOST_CHECK_EQUAL(z21, 1);

  //*
  BOOST_CHECK_EQUAL(z21 * z22, 0);
  BOOST_CHECK_EQUAL(z21 * 3, 1);
  BOOST_CHECK_EQUAL(z22 * 3, 0);
  BOOST_CHECK_EQUAL(6 * z21, 0);
  BOOST_CHECK_EQUAL(6 * z22, 0);
  z21 *= 3;
  BOOST_CHECK_EQUAL(z21, 1);
  z21 *= z22;
  BOOST_CHECK_EQUAL(z21, 0);

  //==
  BOOST_CHECK(z21 == z22);
  BOOST_CHECK(z21 == 0);
  BOOST_CHECK(0 == z21);
  BOOST_CHECK(z22 == 0);
  BOOST_CHECK(0 == z22);
  BOOST_CHECK(z21 != 1);
  BOOST_CHECK(3 != z21);
  BOOST_CHECK(z22 != 1);
  BOOST_CHECK(3 != z22);
}